

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

invalid_param_spec * __thiscall
boost::runtime::specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
::operator<<(specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
             *this,char *val)

{
  long in_RSI;
  invalid_param_spec *in_RDI;
  invalid_param_spec *in_stack_ffffffffffffffc8;
  invalid_param_spec *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::append((char *)(in_RSI + 0x18));
  invalid_param_spec::invalid_param_spec(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }